

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O2

VkImageMemoryBarrier *
vkt::sparse::makeImageMemoryBarrier
          (VkImageMemoryBarrier *__return_storage_ptr__,VkAccessFlags srcAccessMask,
          VkAccessFlags dstAccessMask,VkImageLayout oldLayout,VkImageLayout newLayout,
          deUint32 srcQueueFamilyIndex,deUint32 destQueueFamilyIndex,VkImage image,
          VkImageSubresourceRange subresourceRange)

{
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->srcAccessMask = srcAccessMask;
  __return_storage_ptr__->dstAccessMask = dstAccessMask;
  __return_storage_ptr__->oldLayout = oldLayout;
  __return_storage_ptr__->newLayout = newLayout;
  __return_storage_ptr__->srcQueueFamilyIndex = srcQueueFamilyIndex;
  __return_storage_ptr__->dstQueueFamilyIndex = destQueueFamilyIndex;
  (__return_storage_ptr__->image).m_internal = image.m_internal;
  (__return_storage_ptr__->subresourceRange).aspectMask = subresourceRange.aspectMask;
  (__return_storage_ptr__->subresourceRange).baseMipLevel = subresourceRange.baseMipLevel;
  (__return_storage_ptr__->subresourceRange).levelCount = subresourceRange.levelCount;
  (__return_storage_ptr__->subresourceRange).baseArrayLayer = subresourceRange.baseArrayLayer;
  (__return_storage_ptr__->subresourceRange).layerCount = subresourceRange.layerCount;
  return __return_storage_ptr__;
}

Assistant:

VkImageMemoryBarrier makeImageMemoryBarrier (const VkAccessFlags			srcAccessMask,
											 const VkAccessFlags			dstAccessMask,
											 const VkImageLayout			oldLayout,
											 const VkImageLayout			newLayout,
											 const deUint32					srcQueueFamilyIndex,
											 const deUint32					destQueueFamilyIndex,
											 const VkImage					image,
											 const VkImageSubresourceRange	subresourceRange)
{
	const VkImageMemoryBarrier barrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,	// VkStructureType			sType;
		DE_NULL,								// const void*				pNext;
		srcAccessMask,							// VkAccessFlags			outputMask;
		dstAccessMask,							// VkAccessFlags			inputMask;
		oldLayout,								// VkImageLayout			oldLayout;
		newLayout,								// VkImageLayout			newLayout;
		srcQueueFamilyIndex,					// deUint32					srcQueueFamilyIndex;
		destQueueFamilyIndex,					// deUint32					destQueueFamilyIndex;
		image,									// VkImage					image;
		subresourceRange,						// VkImageSubresourceRange	subresourceRange;
	};
	return barrier;
}